

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_core.cpp
# Opt level: O0

void QTest::qWait(milliseconds msecs)

{
  long lVar1;
  QDeadlineTimer deadline_00;
  bool bVar2;
  duration<long,_std::ratio<1L,_1000L>_> *pdVar3;
  long in_FS_OFFSET;
  QDeadlineTimer deadline;
  milliseconds in_stack_ffffffffffffff98;
  QDeadlineTimer *in_stack_ffffffffffffffa0;
  milliseconds in_stack_ffffffffffffffa8;
  nanoseconds in_stack_ffffffffffffffb0;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  in_stack_ffffffffffffffb8;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> flags;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000l>>
            ((QDeadlineTimer *)in_stack_ffffffffffffff98.__r,
             (duration<long,_std::ratio<1L,_1000L>_>)in_stack_ffffffffffffffa8.__r,PreciseTimer);
  do {
    flags.i = (Int)((ulong)in_stack_ffffffffffffffb8.__r >> 0x20);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_stack_ffffffffffffffa0,
               (ProcessEventsFlag)((ulong)in_stack_ffffffffffffff98.__r >> 0x20));
    deadline_00._8_8_ = in_stack_ffffffffffffffb0.__r;
    deadline_00.t1 = in_stack_ffffffffffffffa8.__r;
    QCoreApplication::processEvents((ProcessEventsFlags)flags.i,deadline_00);
    QCoreApplication::sendPostedEvents
              ((QObject *)in_stack_ffffffffffffffa0,
               (int)((ulong)in_stack_ffffffffffffff98.__r >> 0x20));
    bVar2 = QDeadlineTimer::isForever(in_stack_ffffffffffffffa0);
    if (bVar2) break;
    in_stack_ffffffffffffffb0 =
         QDeadlineTimer::remainingTimeAsDuration(in_stack_ffffffffffffffa8.__r);
    in_stack_ffffffffffffffb8 =
         std::chrono::
         ceil<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                   (in_stack_ffffffffffffff98.__r);
    in_stack_ffffffffffffffa8 = ms<(char)48>();
    bVar2 = std::chrono::operator==
                      ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffa8.__r,
                       (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffa0);
    if (bVar2) break;
    in_stack_ffffffffffffff98 = ms<(char)49,(char)48>();
    pdVar3 = std::min<std::chrono::duration<long,std::ratio<1l,1000l>>>
                       ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff98.__r,
                        (duration<long,_std::ratio<1L,_1000L>_> *)0x42a903);
    in_stack_ffffffffffffffa0 = (QDeadlineTimer *)pdVar3->__r;
    qSleep(in_stack_ffffffffffffff98);
    bVar2 = QDeadlineTimer::hasExpired((QDeadlineTimer *)in_stack_ffffffffffffffb0.__r);
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_CORE_EXPORT void QTest::qWait(std::chrono::milliseconds msecs)
{
    // Ideally this method would be implemented in terms of qWaitFor(), with a
    // predicate that always returns false, but qWaitFor() uses the 1-arg overload
    // of processEvents(), which doesn't handle events posted in this round of event
    // processing, which, together with the 10ms qSleep() after every processEvents(),
    // lead to a 10x slow-down in some webengine tests.

    Q_ASSERT(QCoreApplication::instance());

    using namespace std::chrono;

    QDeadlineTimer deadline(msecs, Qt::PreciseTimer);

    do {
        QCoreApplication::processEvents(QEventLoop::AllEvents, deadline);
        QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);

        // If dealine is Forever, processEvents() has already looped forever
        if (deadline.isForever())
            break;

        msecs = ceil<milliseconds>(deadline.remainingTimeAsDuration());
        if (msecs == 0ms)
            break;

        QTest::qSleep(std::min(10ms, msecs));
    } while (!deadline.hasExpired());
}